

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

uint8_t Assimp::FBX::anon_unknown_3::ReadByte(char *input,char **cursor,char *end)

{
  uint8_t uVar1;
  size_t sVar2;
  uint8_t word;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *end_local;
  char **cursor_local;
  char *input_local;
  
  local_20 = end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  sVar2 = Offset(*cursor,end);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"cannot ReadByte, out of bounds",&local_41);
    TokenizeError(&local_40,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  uVar1 = **(uint8_t **)end_local;
  *(long *)end_local = *(long *)end_local + 1;
  return uVar1;
}

Assistant:

uint8_t ReadByte(const char* input, const char*& cursor, const char* end) {
    if(Offset(cursor, end) < sizeof( uint8_t ) ) {
        TokenizeError("cannot ReadByte, out of bounds",input, cursor);
    }

    uint8_t word;/* = *reinterpret_cast< const uint8_t* >( cursor )*/
    ::memcpy( &word, cursor, sizeof( uint8_t ) );
    ++cursor;

    return word;
}